

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_knot.cpp
# Opt level: O1

double ON_KnotTolerance(int order,int cv_count,double *knot,int knot_index)

{
  double dVar1;
  int iVar2;
  ulong uVar3;
  double *pdVar4;
  uint uVar5;
  int iVar6;
  ulong uVar7;
  double dVar8;
  double dVar9;
  
  iVar2 = order + cv_count + -2;
  iVar6 = -1;
  if (-1 < knot_index - order) {
    iVar6 = knot_index - order;
  }
  uVar5 = iVar6 + 1;
  iVar6 = order + knot_index;
  if (iVar2 <= order + knot_index) {
    iVar6 = iVar2;
  }
  iVar6 = iVar6 + -1;
  uVar3 = (ulong)knot_index;
  uVar7 = (ulong)(uint)knot_index;
  if ((int)uVar5 < knot_index) {
    uVar7 = uVar3;
    do {
      if ((knot[uVar7] != knot[uVar3]) || (NAN(knot[uVar7]) || NAN(knot[uVar3]))) goto LAB_004c156b;
      uVar7 = uVar7 - 1;
    } while ((long)(ulong)uVar5 < (long)uVar7);
    uVar7 = (ulong)uVar5;
  }
LAB_004c156b:
  dVar1 = knot[uVar3];
  dVar8 = dVar1 - knot[(int)uVar7];
  iVar2 = knot_index;
  if (knot_index < iVar6) {
    pdVar4 = knot + uVar3;
    do {
      iVar2 = knot_index;
      if ((*pdVar4 != dVar1) || (NAN(*pdVar4) || NAN(dVar1))) break;
      knot_index = knot_index + 1;
      pdVar4 = pdVar4 + 1;
      iVar2 = iVar6;
    } while (iVar6 != knot_index);
  }
  dVar9 = dVar1 - knot[iVar2];
  if ((((dVar8 == 0.0) && (!NAN(dVar8))) && (dVar9 == 0.0)) && (!NAN(dVar9))) {
    return 0.0;
  }
  return (ABS(dVar1) + ABS(dVar9) + ABS(dVar8)) * 1.490116119385e-08;
}

Assistant:

int ON_KnotCount( int order, int cv_count )
{
  return (order+cv_count-2);
}